

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

sysbvm_tuple_t
sysbvm_function_apply4
          (sysbvm_context_t *context,sysbvm_tuple_t function,sysbvm_tuple_t argument0,
          sysbvm_tuple_t argument1,sysbvm_tuple_t argument2,sysbvm_tuple_t argument3)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t arguments [4];
  
  arguments[0] = argument0;
  arguments[1] = argument1;
  arguments[2] = argument2;
  arguments[3] = argument3;
  sVar1 = sysbvm_function_apply(context,function,4,arguments,0);
  return sVar1;
}

Assistant:

SYSBVM_INLINE sysbvm_tuple_t sysbvm_function_apply4(sysbvm_context_t *context, sysbvm_tuple_t function, sysbvm_tuple_t argument0, sysbvm_tuple_t argument1, sysbvm_tuple_t argument2, sysbvm_tuple_t argument3)
{
    sysbvm_tuple_t arguments[] = {
        argument0,
        argument1,
        argument2,
        argument3,
    };
    
    return sysbvm_function_apply(context, function, 4, arguments, 0);
}